

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_ctpop_i32_sparc(TCGContext_conflict7 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1)

{
  TCGOp *pTVar1;
  uintptr_t o;
  TCGTemp *local_18;
  
  if (have_popcnt_sparc) {
    pTVar1 = tcg_emit_op_sparc(tcg_ctx,INDEX_op_ctpop_i32);
    pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
  }
  else {
    local_18 = (TCGTemp *)(arg1 + (long)tcg_ctx);
    tcg_gen_callN_sparc(tcg_ctx,helper_ctpop_i32_sparc,(TCGTemp *)(ret + (long)tcg_ctx),1,&local_18)
    ;
  }
  return;
}

Assistant:

void tcg_gen_ctpop_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1)
{
    if (TCG_TARGET_HAS_ctpop_i32) {
        tcg_gen_op2_i32(tcg_ctx, INDEX_op_ctpop_i32, ret, arg1);
    } else if (TCG_TARGET_HAS_ctpop_i64) {
        TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_extu_i32_i64(tcg_ctx, t, arg1);
        tcg_gen_ctpop_i64(tcg_ctx, t, t);
        tcg_gen_extrl_i64_i32(tcg_ctx, ret, t);
        tcg_temp_free_i64(tcg_ctx, t);
    } else {
        gen_helper_ctpop_i32(tcg_ctx, ret, arg1);
    }
}